

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * __thiscall mocker::Lexer::nextToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  Position tmpCurPos;
  
  sVar1 = (this->curPos).line;
  sVar2 = (this->curPos).col;
  sVar3 = (this->nxtPos).line;
  sVar4 = (this->nxtPos).col;
  pcVar5 = (this->curBeg)._M_current;
  pcVar6 = (this->nxtBeg)._M_current;
  getToken_abi_cxx11_(__return_storage_ptr__,this);
  (this->curBeg)._M_current = pcVar5;
  (this->nxtBeg)._M_current = pcVar6;
  (this->curPos).line = sVar1;
  (this->curPos).col = sVar2;
  (this->nxtPos).line = sVar3;
  (this->nxtPos).col = sVar4;
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::nextToken() {
  auto tmpCurBeg = curBeg;
  auto tmpNxtBeg = nxtBeg;
  auto tmpCurPos = curPos;
  auto tmpNxtPos = nxtPos;
  auto res = getToken();
  std::tie(curBeg, nxtBeg, curPos, nxtPos) =
      std::tie(tmpCurBeg, tmpNxtBeg, tmpCurPos, tmpNxtPos);
  return res;
}